

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSetupDrawChannels(ImGuiTable *table)

{
  ImGuiTableDrawChannelIdx IVar1;
  ImGuiTableDrawChannelIdx IVar2;
  int iVar3;
  uint uVar4;
  int channels_count;
  ImGuiTableColumn *pIVar5;
  long in_RDI;
  bool bVar6;
  ImGuiTableColumn *column;
  int column_n;
  int draw_channel_current;
  int channels_total;
  int channels_for_dummy;
  int channels_for_bg;
  int channels_for_row;
  int freeze_row_multiplier;
  char local_48;
  char local_40;
  char local_3c;
  int local_34;
  int local_24;
  
  iVar3 = 1;
  if ('\0' < *(char *)(in_RDI + 0x241)) {
    iVar3 = 2;
  }
  if ((*(uint *)(in_RDI + 4) & 0x100000) == 0) {
    local_34 = (int)*(char *)(in_RDI + 0x231);
  }
  else {
    local_34 = 1;
  }
  bVar6 = true;
  if (*(int *)(in_RDI + 0x6c) <= (int)*(char *)(in_RDI + 0x231)) {
    bVar6 = *(long *)(in_RDI + 0x50) != *(long *)(in_RDI + 0x48);
  }
  uVar4 = (uint)bVar6;
  channels_count = iVar3 + 1 + local_34 * iVar3 + uVar4;
  ImDrawListSplitter::Split
            ((ImDrawListSplitter *)CONCAT44(iVar3,local_34),(ImDrawList *)CONCAT44(iVar3 + 1,uVar4),
             channels_count);
  if ((int)uVar4 < 1) {
    local_3c = -1;
  }
  else {
    local_3c = (char)channels_count + -1;
  }
  *(char *)(in_RDI + 0x245) = local_3c;
  *(undefined1 *)(in_RDI + 0x246) = 1;
  if (*(char *)(in_RDI + 0x241) < '\x01') {
    local_40 = '\x01';
  }
  else {
    local_40 = (char)local_34 + '\x02';
  }
  *(char *)(in_RDI + 0x247) = local_40;
  IVar2 = '\x02';
  for (local_24 = 0; local_24 < *(int *)(in_RDI + 0x6c); local_24 = local_24 + 1) {
    pIVar5 = ImSpan<ImGuiTableColumn>::operator[]
                       ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x10),local_24);
    if (((pIVar5->IsVisibleX & 1U) == 0) || ((pIVar5->IsVisibleY & 1U) == 0)) {
      IVar1 = *(ImGuiTableDrawChannelIdx *)(in_RDI + 0x245);
      pIVar5->DrawChannelUnfrozen = IVar1;
      pIVar5->DrawChannelFrozen = IVar1;
    }
    else {
      pIVar5->DrawChannelFrozen = IVar2;
      if (*(char *)(in_RDI + 0x241) < '\x01') {
        local_48 = '\0';
      }
      else {
        local_48 = (char)local_34 + '\x01';
      }
      pIVar5->DrawChannelUnfrozen = IVar2 + local_48;
      if ((*(uint *)(in_RDI + 4) & 0x100000) == 0) {
        IVar2 = IVar2 + '\x01';
      }
    }
    pIVar5->DrawChannelCurrent = pIVar5->DrawChannelFrozen;
  }
  *(undefined8 *)(in_RDI + 300) = *(undefined8 *)(in_RDI + 0x11c);
  *(undefined8 *)(in_RDI + 0x134) = *(undefined8 *)(in_RDI + 0x124);
  *(undefined8 *)(in_RDI + 0x13c) = *(undefined8 *)(*(long *)(in_RDI + 0x1c8) + 600);
  *(undefined8 *)(in_RDI + 0x144) = *(undefined8 *)(*(long *)(in_RDI + 0x1c8) + 0x260);
  *(undefined8 *)(in_RDI + 0x14c) = *(undefined8 *)(in_RDI + 0x15c);
  *(undefined8 *)(in_RDI + 0x154) = *(undefined8 *)(in_RDI + 0x164);
  return;
}

Assistant:

void ImGui::TableSetupDrawChannels(ImGuiTable* table)
{
    const int freeze_row_multiplier = (table->FreezeRowsCount > 0) ? 2 : 1;
    const int channels_for_row = (table->Flags & ImGuiTableFlags_NoClip) ? 1 : table->ColumnsEnabledCount;
    const int channels_for_bg = 1 + 1 * freeze_row_multiplier;
    const int channels_for_dummy = (table->ColumnsEnabledCount < table->ColumnsCount || table->VisibleMaskByIndex != table->EnabledMaskByIndex) ? +1 : 0;
    const int channels_total = channels_for_bg + (channels_for_row * freeze_row_multiplier) + channels_for_dummy;
    table->DrawSplitter.Split(table->InnerWindow->DrawList, channels_total);
    table->DummyDrawChannel = (ImGuiTableDrawChannelIdx)((channels_for_dummy > 0) ? channels_total - 1 : -1);
    table->Bg2DrawChannelCurrent = TABLE_DRAW_CHANNEL_BG2_FROZEN;
    table->Bg2DrawChannelUnfrozen = (ImGuiTableDrawChannelIdx)((table->FreezeRowsCount > 0) ? 2 + channels_for_row : TABLE_DRAW_CHANNEL_BG2_FROZEN);

    int draw_channel_current = 2;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->IsVisibleX && column->IsVisibleY)
        {
            column->DrawChannelFrozen = (ImGuiTableDrawChannelIdx)(draw_channel_current);
            column->DrawChannelUnfrozen = (ImGuiTableDrawChannelIdx)(draw_channel_current + (table->FreezeRowsCount > 0 ? channels_for_row + 1 : 0));
            if (!(table->Flags & ImGuiTableFlags_NoClip))
                draw_channel_current++;
        }
        else
        {
            column->DrawChannelFrozen = column->DrawChannelUnfrozen = table->DummyDrawChannel;
        }
        column->DrawChannelCurrent = column->DrawChannelFrozen;
    }

    // Initial draw cmd starts with a BgClipRect that matches the one of its host, to facilitate merge draw commands by default.
    // All our cell highlight are manually clipped with BgClipRect. When unfreezing it will be made smaller to fit scrolling rect.
    // (This technically isn't part of setting up draw channels, but is reasonably related to be done here)
    table->BgClipRect = table->InnerClipRect;
    table->Bg0ClipRectForDrawCmd = table->OuterWindow->ClipRect;
    table->Bg2ClipRectForDrawCmd = table->HostClipRect;
    IM_ASSERT(table->BgClipRect.Min.y <= table->BgClipRect.Max.y);
}